

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_fft.cpp
# Opt level: O1

bool fft::RandomImageFFT(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint32_t width;
  ulong uVar4;
  uint uVar5;
  uchar *__s2;
  bool bVar6;
  bool bVar7;
  Image input;
  Image output;
  Image diracDelta;
  FFTExecutor fftExecutor;
  ComplexData complexDataDracDelta;
  ComplexData complexDataInput;
  Image local_110;
  ulong local_e8;
  uchar *local_e0;
  ulong local_d8;
  Image local_d0;
  ImageTemplate<unsigned_char> local_a8;
  FFTExecutor local_80;
  ComplexData local_60;
  ComplexData local_48;
  
  bVar6 = false;
  uVar3 = 0;
  do {
    uVar1 = rand();
    width = 2 << (uVar1 - (uVar1 / 0xb + (uVar1 / 0xb) * 10) & 0x1f);
    Unit_Test::randomImage(&local_110,width,width);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (&local_a8,local_110._width,local_110._height,'\x01','\x01');
    PenguinV_Image::ImageTemplate<unsigned_char>::fill(&local_a8,'\0');
    local_a8._data[(local_a8._width >> 1) + (local_a8._height >> 1) * local_a8._rowSize] = '\x01';
    FFT::ComplexData::ComplexData(&local_48,&local_110);
    FFT::ComplexData::ComplexData(&local_60,&local_a8);
    FFT::FFTExecutor::FFTExecutor(&local_80,local_110._width,local_110._height);
    FFT::FFTExecutor::directTransform(&local_80,&local_48);
    FFT::FFTExecutor::directTransform(&local_80,&local_60);
    FFT::FFTExecutor::complexMultiplication(&local_80,&local_48,&local_60,&local_48);
    FFT::FFTExecutor::inverseTransform(&local_80,&local_48);
    FFT::ComplexData::get(&local_d0,&local_48);
    if (((local_110._height == local_d0._height) && (local_110._width == local_d0._width)) &&
       (local_110._colorCount == local_d0._colorCount)) {
      local_d8 = (ulong)local_110._rowSize;
      uVar1 = local_110._height * local_110._rowSize;
      bVar7 = uVar1 == 0;
      if (!bVar7) {
        uVar5 = local_110._width * local_110._colorCount;
        local_e0 = local_110._data;
        local_e8 = (ulong)local_d0._rowSize;
        uVar4 = 0;
        __s2 = local_d0._data;
        do {
          iVar2 = bcmp(local_e0 + uVar4,__s2,(ulong)uVar5);
          if (iVar2 != 0) goto LAB_0013791e;
          __s2 = __s2 + local_e8;
          uVar4 = uVar4 + local_d8;
          bVar7 = uVar1 == uVar4;
        } while (!bVar7);
      }
    }
    else {
LAB_0013791e:
      bVar7 = false;
    }
    local_d0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_d0);
    FFT::FFTExecutor::~FFTExecutor(&local_80);
    FFT::ComplexData::~ComplexData(&local_60);
    FFT::ComplexData::~ComplexData(&local_48);
    local_a8._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_a8);
    local_110._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_110);
    if (!bVar7) {
      return bVar6;
    }
    bVar6 = 0x1e < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x20) {
      return bVar6;
    }
  } while( true );
}

Assistant:

bool RandomImageFFT()
    {
        for ( uint32_t i = 0u; i < 32u; ++i ) { // a special case for FFT because it take a lot of time for execution
            const uint32_t dimension = (2u << Unit_Test::randomValue<uint8_t>( 11 ));

            const PenguinV_Image::Image input = Unit_Test::randomImage( dimension, dimension );

            PenguinV_Image::Image diracDelta( input.width(), input.height() );
            diracDelta.fill( 0u );
            diracDelta.data()[diracDelta.height() / 2 * diracDelta.rowSize() + diracDelta.width() / 2 ] = 1u;

            FFT::ComplexData complexDataInput( input );
            FFT::ComplexData complexDataDracDelta( diracDelta );

            FFT::FFTExecutor fftExecutor( input.width(), input.height() );

            fftExecutor.directTransform( complexDataInput );
            fftExecutor.directTransform( complexDataDracDelta );
            fftExecutor.complexMultiplication( complexDataInput, complexDataDracDelta, complexDataInput );
            fftExecutor.inverseTransform( complexDataInput );

            const PenguinV_Image::Image output = complexDataInput.get();

            if( input.height() != output.height() || input.width() != output.width() || input.colorCount() != output.colorCount() )
                return false;

            const uint32_t rowSizeIn  = input.rowSize();
            const uint32_t rowSizeOut = output.rowSize();
            const uint32_t width = input.width() * input.colorCount();
            const uint8_t * inY  = input.data();
            const uint8_t * outY = output.data();
            const uint8_t * inYEnd = inY + rowSizeIn * input.height();

            for ( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
                if ( memcmp( inY, outY, width ) != 0 )
                    return false;
            }
        }
        return true;
    }